

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O1

void grd_flupgrad(grd_st_t *grd_st,seq_t *seq)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  mdl_t *pmVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  uint64_t uVar14;
  ulong uVar15;
  uint32_t y;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  anon_union_8_2_94730072 old;
  
  pmVar7 = grd_st->mdl;
  pdVar8 = grd_st->g;
  uVar17 = (ulong)pmVar7->nlbl;
  uVar6 = seq->len;
  uVar15 = (ulong)uVar6;
  pdVar9 = grd_st->psi;
  pdVar10 = grd_st->alpha;
  pdVar11 = grd_st->beta;
  pdVar12 = grd_st->bnorm;
  if (uVar15 != 0) {
    pdVar13 = grd_st->unorm;
    uVar19 = 0;
    do {
      if (uVar17 != 0) {
        uVar21 = 0;
        do {
          if (*(int *)&seq[uVar19 * 2 + 1].field_0x4 != 0) {
            dVar1 = pdVar10[uVar19 * uVar17 + uVar21];
            dVar2 = pdVar11[uVar19 * uVar17 + uVar21];
            dVar3 = pdVar13[uVar19];
            uVar18 = 0;
            do {
              uVar14 = pmVar7->uoff[*(long *)(*(long *)(seq + uVar19 * 2 + 2) + uVar18 * 8)];
              do {
                dVar4 = pdVar8[uVar21 + uVar14];
                LOCK();
                bVar22 = dVar4 == pdVar8[uVar21 + uVar14];
                if (bVar22) {
                  pdVar8[uVar21 + uVar14] = dVar4 + dVar1 * dVar2 * dVar3;
                }
                UNLOCK();
              } while (!bVar22);
              uVar18 = uVar18 + 1;
            } while (uVar18 < *(uint *)&seq[uVar19 * 2 + 1].field_0x4);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar17);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar15);
  }
  if (1 < uVar6) {
    uVar19 = 1;
    do {
      if (uVar17 != 0) {
        uVar18 = 0;
        uVar21 = 0;
        do {
          uVar16 = 0;
          do {
            if (*(int *)&seq[uVar19 * 2 + 1].raw != 0) {
              dVar1 = pdVar10[(uVar19 - 1) * uVar17 + uVar18];
              dVar2 = pdVar11[uVar19 * uVar17 + uVar16];
              dVar3 = pdVar9[uVar17 * uVar17 * uVar19 + uVar18 * uVar17 + uVar16];
              dVar4 = pdVar12[uVar19];
              uVar20 = 0;
              do {
                uVar14 = pmVar7->boff[seq[uVar19 * 2 + 2].raw[uVar20]];
                do {
                  dVar5 = pdVar8[uVar21 + uVar14];
                  LOCK();
                  bVar22 = dVar5 == pdVar8[uVar21 + uVar14];
                  if (bVar22) {
                    pdVar8[uVar21 + uVar14] = dVar5 + dVar1 * dVar2 * dVar3 * dVar4;
                  }
                  UNLOCK();
                } while (!bVar22);
                uVar20 = uVar20 + 1;
              } while (uVar20 < *(uint *)&seq[uVar19 * 2 + 1].raw);
            }
            uVar16 = uVar16 + 1;
            uVar21 = (ulong)((int)uVar21 + 1);
          } while (uVar16 != uVar17);
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar17);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar15);
  }
  return;
}

Assistant:

void grd_flupgrad(grd_st_t *grd_st, const seq_t *seq) {
	const mdl_t *mdl = grd_st->mdl;
	const uint32_t Y = mdl->nlbl;
	const uint32_t T = seq->len;
	const double (*psi  )[T][Y][Y] = (void *)grd_st->psi;
	const double (*alpha)[T][Y]    = (void *)grd_st->alpha;
	const double (*beta )[T][Y]    = (void *)grd_st->beta;
	const double  *unorm           =         grd_st->unorm;
	const double  *bnorm           =         grd_st->bnorm;
	double *g = grd_st->g;
	for (uint32_t t = 0; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		for (uint32_t y = 0; y < Y; y++) {
			double e = (*alpha)[t][y] * (*beta)[t][y] * unorm[t];
			for (uint32_t n = 0; n < pos->ucnt; n++) {
				const uint64_t o = pos->uobs[n];
				atm_inc(g + mdl->uoff[o] + y, e);
			}
		}
	}
	for (uint32_t t = 1; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		for (uint32_t yp = 0, d = 0; yp < Y; yp++) {
			for (uint32_t y = 0; y < Y; y++, d++) {
				double e = (*alpha)[t - 1][yp] * (*beta)[t][y]
				         * (*psi)[t][yp][y] * bnorm[t];
				for (uint32_t n = 0; n < pos->bcnt; n++) {
					const uint64_t o = pos->bobs[n];
					atm_inc(g + mdl->boff[o] + d, e);
				}
			}
		}
	}
}